

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O2

void Synthesizer::HandleEvent(EffectData *data,UInt32 msg,float sampletime)

{
  uint uVar1;
  uint uVar2;
  uint velocity;
  uint note;
  long lVar3;
  
  uVar1 = (msg & 0xf0) - 0x80 >> 4;
  if (uVar1 < 8) {
    uVar2 = msg & 0xf;
    note = msg >> 8 & 0xff;
    velocity = msg >> 0x10 & 0xff;
    switch(uVar1) {
    case 1:
      if (velocity != 0) {
        data->arpkeys[note] = 1;
        SynthesizerChannel::NoteOn(data->synthchannel + uVar2,note,velocity,data->p,sampletime);
        return;
      }
    case 0:
      data->arpkeys[note] = 0;
      SynthesizerChannel::NoteOff(data->synthchannel + uVar2,note,velocity,data->p,sampletime);
      return;
    case 3:
      data->synthchannel[uVar2].ctrl[note] = (float)velocity * 0.007874016;
      break;
    case 7:
      if (uVar2 == 8) {
        scheduledata.writepos = 0;
        scheduledata.readpos = 0;
        memset(data->arpkeys,0,0x204);
        for (lVar3 = 0; lVar3 != 0x7080; lVar3 = lVar3 + 0x708) {
          memset((void *)((long)data->synthchannel[0].keys + lVar3),0,0x400);
          *(undefined4 *)((long)&data->synthchannel[0].numvoices + lVar3) = 0;
        }
      }
    }
  }
  return;
}

Assistant:

static void HandleEvent(EffectData* data, UInt32 msg, float sampletime)
    {
        int channel = msg & 15;
        int command = msg & 0xF0;
        int data1 = (msg >> 8) & 255;
        int data2 = (msg >> 16) & 255;
        SynthesizerChannel* synthchannel = &data->synthchannel[channel];
        switch (command)
        {
            case 0x90:
                if (data2 > 0)
                {
                    data->arpkeys[data1] = 1;
                    synthchannel->NoteOn(data1, data2, data->p, sampletime);
                    break;
                }
            case 0x80:
                data->arpkeys[data1] = 0;
                synthchannel->NoteOff(data1, data2, data->p, sampletime);
                break;
            case 0xB0:
                synthchannel->Control(data1, data2, data->p, sampletime);
                break;
            case 0xF0:
                if (channel == 8)
                {
                    // All sound off
                    scheduledata.Clear();
                    data->numpending = 0;
                    memset(data->arpkeys, 0, sizeof(data->arpkeys));
                    for (int c = 0; c < 16; c++)
                    {
                        SynthesizerChannel* synthchannel = &data->synthchannel[c];
                        memset(synthchannel->keys, 0, sizeof(synthchannel->keys));
                        synthchannel->numvoices = 0;
                    }
                }
                break;
        }
    }